

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

Node * __thiscall anon_unknown.dwarf_4153d9::Db::parseBracedExpr(Db *this)

{
  char cVar1;
  char *pcVar2;
  Node *pNVar3;
  Node *pNVar4;
  Node *pNVar5;
  Node *pNVar6;
  NameState *in_RSI;
  
  pcVar2 = this->First;
  if (((this->Last != pcVar2) && (1 < (ulong)((long)this->Last - (long)pcVar2))) && (*pcVar2 == 'd')
     ) {
    cVar1 = pcVar2[1];
    if (cVar1 == 'X') {
      this->First = pcVar2 + 2;
      pNVar3 = parseExpr(this);
      if (((pNVar3 != (Node *)0x0) && (pNVar4 = parseExpr(this), pNVar4 != (Node *)0x0)) &&
         (pNVar5 = parseBracedExpr(this), pNVar5 != (Node *)0x0)) {
        pNVar6 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar6->K = KBracedRangeExpr;
        pNVar6->RHSComponentCache = No;
        pNVar6->ArrayCache = No;
        pNVar6->FunctionCache = No;
        pNVar6->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001e3ff0;
        pNVar6[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar6[1].K = pNVar4;
        pNVar6[2]._vptr_Node = (_func_int **)pNVar5;
        return pNVar6;
      }
    }
    else if (cVar1 == 'x') {
      this->First = pcVar2 + 2;
      pNVar3 = parseExpr(this);
      if ((pNVar3 != (Node *)0x0) && (pNVar4 = parseBracedExpr(this), pNVar4 != (Node *)0x0)) {
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar5->K = KBracedExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001e3f98;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar5[1].K = pNVar4;
        *(undefined1 *)&pNVar5[2]._vptr_Node = 1;
        return pNVar5;
      }
    }
    else {
      if (cVar1 != 'i') goto LAB_00197484;
      this->First = pcVar2 + 2;
      pNVar3 = parseSourceName(this,in_RSI);
      if ((pNVar3 != (Node *)0x0) && (pNVar4 = parseBracedExpr(this), pNVar4 != (Node *)0x0)) {
        pNVar5 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
        pNVar5->K = KBracedExpr;
        pNVar5->RHSComponentCache = No;
        pNVar5->ArrayCache = No;
        pNVar5->FunctionCache = No;
        pNVar5->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001e3f98;
        pNVar5[1]._vptr_Node = (_func_int **)pNVar3;
        *(Node **)&pNVar5[1].K = pNVar4;
        *(undefined1 *)&pNVar5[2]._vptr_Node = 0;
        return pNVar5;
      }
    }
    return (Node *)0x0;
  }
LAB_00197484:
  pNVar3 = parseExpr(this);
  return pNVar3;
}

Assistant:

Node *Db::parseBracedExpr() {
  if (look() == 'd') {
    switch (look(1)) {
    case 'i': {
      First += 2;
      Node *Field = parseSourceName(/*NameState=*/nullptr);
      if (Field == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Field, Init, /*isArray=*/false);
    }
    case 'x': {
      First += 2;
      Node *Index = parseExpr();
      if (Index == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedExpr>(Index, Init, /*isArray=*/true);
    }
    case 'X': {
      First += 2;
      Node *RangeBegin = parseExpr();
      if (RangeBegin == nullptr)
        return nullptr;
      Node *RangeEnd = parseExpr();
      if (RangeEnd == nullptr)
        return nullptr;
      Node *Init = parseBracedExpr();
      if (Init == nullptr)
        return nullptr;
      return make<BracedRangeExpr>(RangeBegin, RangeEnd, Init);
    }
    }
  }
  return parseExpr();
}